

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

void capnp::_::WireHelpers::setCapabilityPointer
               (SegmentBuilder *segment,CapTableBuilder *capTable,WirePointer *ref,
               Own<capnp::ClientHook> *cap)

{
  bool bVar1;
  uint index;
  ClientHook *this;
  Own<capnp::ClientHook> *pOVar2;
  Own<capnp::ClientHook> *cap_local;
  WirePointer *ref_local;
  CapTableBuilder *capTable_local;
  SegmentBuilder *segment_local;
  
  bVar1 = WirePointer::isNull(ref);
  if (!bVar1) {
    zeroObject(segment,capTable,ref);
  }
  this = kj::Own<capnp::ClientHook>::operator->(cap);
  bVar1 = ClientHook::isNull(this);
  if (bVar1) {
    zeroMemory(ref);
  }
  else {
    pOVar2 = kj::mv<kj::Own<capnp::ClientHook>>(cap);
    index = (*(capTable->super_CapTableReader)._vptr_CapTableReader[1])(capTable,pOVar2);
    WirePointer::setCap(ref,index);
  }
  return;
}

Assistant:

static void setCapabilityPointer(
      SegmentBuilder* segment, CapTableBuilder* capTable, WirePointer* ref,
      kj::Own<ClientHook>&& cap) {
    if (!ref->isNull()) {
      zeroObject(segment, capTable, ref);
    }
    if (cap->isNull()) {
      zeroMemory(ref);
    } else {
      ref->setCap(capTable->injectCap(kj::mv(cap)));
    }
  }